

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O0

double StrToD16(uc16 *str16,int length,int flags,double empty_string_value,
               int *processed_characters_count,bool *processed_all,uc16 separator)

{
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  undefined8 in_R8;
  uc16 in_R9W;
  double in_XMM0_Qa;
  double dVar1;
  double result;
  StringToDoubleConverter converter;
  undefined4 in_stack_ffffffffffffff88;
  uc16 *in_stack_ffffffffffffff98;
  StringToDoubleConverter *in_stack_ffffffffffffffa0;
  
  dVar1 = double_conversion::Double::NaN();
  double_conversion::StringToDoubleConverter::StringToDoubleConverter
            ((StringToDoubleConverter *)&stack0xffffffffffffffa0,in_EDX,in_XMM0_Qa,dVar1,(char *)0x0
             ,(char *)0x0,in_R9W);
  dVar1 = double_conversion::StringToDoubleConverter::StringToDouble
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     (int)((ulong)in_XMM0_Qa >> 0x20),
                     (int *)CONCAT44(in_EDX,in_stack_ffffffffffffff88));
  *(bool *)in_R8 = in_ESI == *in_RCX;
  return dVar1;
}

Assistant:

static double StrToD16(const uc16* str16, int length, int flags,
                       double empty_string_value,
                       int* processed_characters_count, bool* processed_all,
                       uc16 separator = StringToDoubleConverter::kNoSeparator) {
  StringToDoubleConverter converter(flags, empty_string_value, Double::NaN(),
                                    NULL, NULL, separator);
  double result =
      converter.StringToDouble(str16, length, processed_characters_count);
  *processed_all = (length == *processed_characters_count);
  return result;
}